

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

int getWindowState(_GLFWwindow *window)

{
  CARD32 CVar1;
  int actualFormat;
  anon_struct_16_2_032570bf *state;
  unsigned_long local_38;
  unsigned_long itemCount;
  Atom actualType;
  
  state = (anon_struct_16_2_032570bf *)0x0;
  CVar1 = 0;
  (*_glfw.x11.xlib.GetWindowProperty)
            (_glfw.x11.display,(Window)window,_glfw.x11.WM_STATE,0,0x7fffffffffffffff,0,
             _glfw.x11.WM_STATE,&actualType,&actualFormat,&itemCount,&local_38,(uchar **)&state);
  if (itemCount < 2) {
    if (state == (anon_struct_16_2_032570bf *)0x0) {
      return 0;
    }
  }
  else {
    CVar1 = state->state;
  }
  (*_glfw.x11.xlib.Free)(state);
  return CVar1;
}

Assistant:

static int getWindowState(_GLFWwindow* window)
{
    int result = WithdrawnState;
    struct {
        CARD32 state;
        Window icon;
    } *state = NULL;

    if (_glfwGetWindowPropertyX11(window->x11.handle,
                                  _glfw.x11.WM_STATE,
                                  _glfw.x11.WM_STATE,
                                  (unsigned char**) &state) >= 2)
    {
        result = state->state;
    }

    if (state)
        XFree(state);

    return result;
}